

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::unit_quick_match(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  precise_unit pVar4;
  string *local_70;
  double local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  precise_unit retunit;
  uint64_t match_flags_local;
  string *unit_string_local;
  double local_10;
  
  retunit._8_8_ = match_flags;
  if ((match_flags & 0x200) != 0) {
    cleanUnitString(unit_string,match_flags);
  }
  _local_38 = get_unit(unit_string,retunit._8_8_);
  bVar1 = is_valid((precise_unit *)local_38);
  if (bVar1) {
    unit_string_local = (string *)local_38;
    local_10 = retunit.multiplier_;
  }
  else {
    uVar2 = std::__cxx11::string::size();
    if ((uVar2 < 3) || (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 != 's')) {
      pcVar3 = (char *)std::__cxx11::string::front();
      if ((*pcVar3 == '[') && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 == ']')) {
        std::__cxx11::string::pop_back();
        pcVar3 = (char *)std::__cxx11::string::back();
        if ((*pcVar3 != 'U') && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 != 'u')) {
          local_58._M_current = (char *)std::__cxx11::string::begin();
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&local_58);
          std::__cxx11::string::erase(unit_string,local_50);
          pVar4 = get_unit(unit_string,retunit._8_8_);
          local_70 = (string *)pVar4.multiplier_;
          local_68 = pVar4._8_8_;
          local_38 = (undefined1  [8])local_70;
          retunit.multiplier_ = local_68;
          bVar1 = is_valid((precise_unit *)local_38);
          if (bVar1) {
            unit_string_local = (string *)local_38;
            local_10 = retunit.multiplier_;
            goto LAB_001bc64a;
          }
        }
      }
    }
    else {
      std::__cxx11::string::pop_back();
      local_48 = (undefined1  [16])get_unit(unit_string,retunit._8_8_);
      local_38 = (undefined1  [8])local_48._0_8_;
      retunit.multiplier_ = (double)local_48._8_8_;
      bVar1 = is_valid((precise_unit *)local_38);
      if (bVar1) {
        unit_string_local = (string *)local_38;
        local_10 = retunit.multiplier_;
        goto LAB_001bc64a;
      }
    }
    unit_string_local = (string *)0x7ff4000000000000;
    local_10 = 2.07707442941207e-314;
  }
LAB_001bc64a:
  pVar4._8_8_ = local_10;
  pVar4.multiplier_ = (double)unit_string_local;
  return pVar4;
}

Assistant:

static precise_unit
    unit_quick_match(std::string unit_string, std::uint64_t match_flags)
{
    if ((match_flags & case_insensitive) != 0) {  // if not a case insensitive
                                                  // matching process just do a
                                                  // quick scan first
        cleanUnitString(unit_string, match_flags);
    }
    auto retunit = get_unit(unit_string, match_flags);
    if (is_valid(retunit)) {
        return retunit;
    }
    if (unit_string.size() > 2 &&
        unit_string.back() == 's') {  // if the string is of length two this
                                      // is too risky to try since there
                                      // would be many incorrect matches
        unit_string.pop_back();
        retunit = get_unit(unit_string, match_flags);
        if (is_valid(retunit)) {
            return retunit;
        }
    } else if (unit_string.front() == '[' && unit_string.back() == ']') {
        unit_string.pop_back();
        if (unit_string.back() != 'U' && unit_string.back() != 'u') {
            unit_string.erase(unit_string.begin());
            retunit = get_unit(unit_string, match_flags);
            if (is_valid(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}